

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.h
# Opt level: O2

bool __thiscall Js::ByteCodeWriter::DoProfileNewScObjArrayOp(ByteCodeWriter *this,OpCode op)

{
  bool bVar1;
  uint sourceContextId;
  LocalFunctionId functionId;
  
  sourceContextId = FunctionProxy::GetSourceContextId((FunctionProxy *)this->m_functionWrite);
  functionId = FunctionProxy::GetLocalFunctionId((FunctionProxy *)this->m_functionWrite);
  bVar1 = Phases::IsEnabled((Phases *)&DAT_01441eb0,NativeArrayPhase,sourceContextId,functionId);
  if ((!bVar1) &&
     (bVar1 = FunctionProxy::IsInDebugMode((FunctionProxy *)this->m_functionWrite), !bVar1)) {
    return (op - NewScObjArray & 0xfffd) == 0;
  }
  return false;
}

Assistant:

bool DoProfileNewScObjArrayOp(OpCode op)
        {
            return
                !PHASE_OFF(NativeArrayPhase, m_functionWrite) &&
                !m_functionWrite->IsInDebugMode() &&
                (op == OpCode::NewScObjArray || op == OpCode::NewScObjArraySpread);
        }